

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_system.cpp
# Opt level: O2

void I_FatalError(char *error,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argptr;
  undefined1 local_4b8 [8];
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  undefined8 local_418;
  char errortext [1024];
  
  if (in_AL != '\0') {
    local_488 = in_XMM0_Qa;
    local_478 = in_XMM1_Qa;
    local_468 = in_XMM2_Qa;
    local_458 = in_XMM3_Qa;
    local_448 = in_XMM4_Qa;
    local_438 = in_XMM5_Qa;
    local_428 = in_XMM6_Qa;
    local_418 = in_XMM7_Qa;
  }
  gameisdead = true;
  local_4b0 = in_RSI;
  local_4a8 = in_RDX;
  local_4a0 = in_RCX;
  local_498 = in_R8;
  local_490 = in_R9;
  if (I_FatalError(char_const*,...)::alreadyThrown == '\0') {
    I_FatalError(char_const*,...)::alreadyThrown = '\x01';
    argptr[0].reg_save_area = local_4b8;
    argptr[0].overflow_arg_area = &stack0x00000008;
    argptr[0].gp_offset = 8;
    argptr[0].fp_offset = 0x30;
    vsnprintf(errortext,0x400,error,argptr);
    if (Logfile != (FILE *)0x0) {
      fprintf((FILE *)Logfile,"\n**** DIED WITH FATAL ERROR:\n%s\n",errortext);
      fflush((FILE *)Logfile);
    }
    fprintf(_stderr,"%s\n",errortext);
  }
  else {
    if (has_exited != '\0') {
      return;
    }
    has_exited = '\x01';
  }
  exit(-1);
}

Assistant:

void I_FatalError (const char *error, ...)
{
    static bool alreadyThrown = false;
    gameisdead = true;

    if (!alreadyThrown)		// ignore all but the first message -- killough
    {
		alreadyThrown = true;
		char errortext[MAX_ERRORTEXT];
		int index;
		va_list argptr;
		va_start (argptr, error);
		index = vsnprintf (errortext, MAX_ERRORTEXT, error, argptr);
		va_end (argptr);

#ifdef __APPLE__
		Mac_I_FatalError(errortext);
#endif // __APPLE__		
		
		// Record error to log (if logging)
		if (Logfile)
		{
			fprintf (Logfile, "\n**** DIED WITH FATAL ERROR:\n%s\n", errortext);
			fflush (Logfile);
		}
//		throw CFatalError (errortext);
		fprintf (stderr, "%s\n", errortext);
		exit (-1);
    }

    if (!has_exited)	// If it hasn't exited yet, exit now -- killough
    {
		has_exited = 1;	// Prevent infinitely recursive exits -- killough
		exit(-1);
    }
}